

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O0

void kratos::uniquify_generators(Generator *top)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar1;
  size_type __n;
  element_type *this_00;
  size_type sVar2;
  __node_base_ptr p_Var3;
  reference ppGVar4;
  reference __b;
  reference ppGVar5;
  size_type sVar6;
  mapped_type *ppGVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar8;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar9;
  format_args args;
  string_view format_str;
  undefined1 local_2c8 [8];
  string old_name;
  undefined1 local_294 [4];
  undefined1 local_290 [8];
  string new_name;
  uint32_t count;
  _Node_iterator_base<std::pair<const_unsigned_long,_kratos::Generator_*>,_false> local_248;
  _Node_iterator_base<std::pair<const_unsigned_long,_kratos::Generator_*>,_false> local_240;
  uint64_t local_238;
  uint64_t hash;
  Generator *ptr;
  iterator __end2_1;
  iterator __begin2_1;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *__range2_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_names;
  unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
  name_map;
  uint64_t i;
  uint64_t head;
  element_type *local_188;
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *local_180;
  shared_ptr<kratos::Generator> *m;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range2;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> module_instances;
  undefined1 local_138 [8];
  set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  module_sets;
  value_type *name;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  Context *context;
  Generator *top_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs;
  size_t local_48;
  char *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_10;
  
  context = (Context *)top;
  names = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)Generator::context(top);
  Context::get_generator_names_abi_cxx11_
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(Context *)names);
  local_b0 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1;
  __end1 = std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  name = (value_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)&name);
    if (!bVar1) break;
    module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::__detail::
                 _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                 ::operator*(&__end1);
    Context::get_generators_by_name
              ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)local_138,(Context *)names,
               (string *)module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)&__range2);
    __n = std::
          set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ::size((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *)local_138);
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)&__range2,__n);
    __end2 = std::
             set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
             ::begin((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      *)local_138);
    m = (shared_ptr<kratos::Generator> *)
        std::
        set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::end((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               *)local_138);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&m);
      if (!bVar1) break;
      local_180 = &std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_>::operator*
                             (&__end2)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
      this_00 = std::
                __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_180);
      bVar1 = Generator::external(this_00);
      if (!bVar1) {
        local_188 = std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get(local_180)
        ;
        std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
        emplace_back<kratos::Generator*>
                  ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)&__range2,
                   &local_188);
      }
      std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_>::operator++(&__end2);
    }
    sVar2 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::size
                      ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                       &__range2);
    if (sVar2 != 1) {
      bVar1 = Context::track_generated((Context *)names);
      if (bVar1) {
        i = 0;
        name_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
        while( true ) {
          p_Var3 = (__node_base_ptr)
                   std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::size
                             ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                              &__range2);
          this = names;
          if (p_Var3 <= name_map._M_h._M_single_bucket) break;
          ppGVar4 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::
                    operator[]((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                               &__range2,(size_type)name_map._M_h._M_single_bucket);
          bVar1 = Context::is_generated_tracked((Context *)this,*ppGVar4);
          if (bVar1) {
            ppGVar4 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::
                      operator[]((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                                  *)&__range2,(size_type)name_map._M_h._M_single_bucket);
            __b = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::operator[]
                            ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                             &__range2,i);
            std::swap<kratos::Generator*>(ppGVar4,__b);
            i = i + 1;
          }
          name_map._M_h._M_single_bucket =
               (__node_base_ptr)((long)&(name_map._M_h._M_single_bucket)->_M_nxt + 1);
        }
      }
      std::
      unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
      ::unordered_map((unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
                       *)&new_names._M_h._M_single_bucket);
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2_1);
      __end2_1 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::begin
                           ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                            &__range2);
      ptr = (Generator *)
            std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::end
                      ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                       &__range2);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                            *)&ptr);
        if (!bVar1) break;
        ppGVar5 = __gnu_cxx::
                  __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                  ::operator*(&__end2_1);
        hash = (uint64_t)*ppGVar5;
        bVar1 = Context::has_hash((Context *)names,(Generator *)hash);
        if (bVar1) {
          local_238 = Context::get_hash((Context *)names,(Generator *)hash);
          local_240._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
               ::find((unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
                       *)&new_names._M_h._M_single_bucket,&local_238);
          local_248._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
               ::end((unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
                      *)&new_names._M_h._M_single_bucket);
          bVar1 = std::__detail::operator==(&local_240,&local_248);
          if (bVar1) {
            std::
            unordered_map<unsigned_long,kratos::Generator*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,kratos::Generator*>>>
            ::emplace<unsigned_long&,kratos::Generator*const&>
                      ((unordered_map<unsigned_long,kratos::Generator*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,kratos::Generator*>>>
                        *)&new_names._M_h._M_single_bucket,&local_238,(Generator **)&hash);
            bVar1 = std::
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range2_1);
            if (bVar1) {
              std::
              unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<std::__cxx11::string&>
                        ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&__range2_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (hash + 0x78));
            }
            else {
              sVar6 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range2_1);
              new_name.field_2._12_4_ = (int)sVar6 + -1;
              do {
                local_294 = (undefined1  [4])new_name.field_2._12_4_;
                local_38 = local_290;
                local_40 = "{0}_unq{1}";
                local_48 = module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count;
                vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)local_294;
                new_name.field_2._12_4_ = new_name.field_2._12_4_ + 1;
                fmt::v7::make_args_checked<std::__cxx11::string_const&,unsigned_int,char[11],char>
                          (&local_78,(v7 *)"{0}_unq{1}",
                           (char (*) [11])
                           module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,
                           (remove_reference_t<unsigned_int> *)in_R8.values_);
                local_58 = &local_78;
                bVar8 = fmt::v7::to_string_view<char,_0>(local_40);
                local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                            *)&top_local;
                local_30 = local_58;
                local_20 = local_58;
                local_10 = local_58;
                local_18 = local_28;
                local_88 = bVar8;
                fmt::v7::
                basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                ::basic_format_args(local_28,0x2d,
                                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                     *)local_58);
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .field_1.values_ = in_R9.values_;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .desc_ = (unsigned_long_long)local_90.values_;
                format_str.size_ = (size_t)top_local;
                format_str.data_ = (char *)local_88.size_;
                in_R8 = local_90;
                fmt::v7::detail::vformat_abi_cxx11_
                          ((string *)local_290,(detail *)local_88.data_,format_str,args);
                bVar1 = Context::generator_name_exists((Context *)names,(string *)local_290);
                if (bVar1) {
                  head._4_4_ = 0;
                }
                else {
                  Context::change_generator_name
                            ((Context *)names,(Generator *)hash,(string *)local_290);
                  head._4_4_ = 0xc;
                }
                std::__cxx11::string::~string((string *)local_290);
              } while (head._4_4_ == 0);
              pVar9 = std::
                      unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::emplace<std::__cxx11::string&>
                                ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&__range2_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(hash + 0x78));
              old_name.field_2._8_8_ =
                   pVar9.first.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ._M_cur;
            }
          }
          else {
            ppGVar7 = std::
                      unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
                      ::at((unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
                            *)&new_names._M_h._M_single_bucket,&local_238);
            std::__cxx11::string::string((string *)local_2c8,(string *)&(*ppGVar7)->name);
            Context::change_generator_name((Context *)names,(Generator *)hash,(string *)local_2c8);
            std::__cxx11::string::~string((string *)local_2c8);
          }
        }
        __gnu_cxx::
        __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
        ::operator++(&__end2_1);
      }
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_1);
      std::
      unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
      ::~unordered_map((unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
                        *)&new_names._M_h._M_single_bucket);
    }
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~vector
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)&__range2);
    std::
    set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~set((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
            *)local_138);
    std::__detail::
    _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++(&__end1);
  }
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  return;
}

Assistant:

void uniquify_generators(Generator* top) {
    // we assume users has run the hash_generators function
    Context* context = top->context();
    auto const& names = context->get_generator_names();
    for (auto const& name : names) {
        auto const module_sets = context->get_generators_by_name(name);
        std::vector<Generator*> module_instances;
        module_instances.reserve(module_sets.size());
        for (auto const& m : module_sets) {
            if (m->external()) continue;
            module_instances.emplace_back(m.get());
        }
        // notice that since it is a set copied by value, it is fine to iterate through it
        if (module_instances.size() == 1)
            // only one module. we are good
            continue;
        // reordering based on whether it's being tracked
        if (context->track_generated()) {
            // O(n) algorithm. it does not need to be inplace
            uint64_t head = 0;
            for (uint64_t i = 0; i < module_instances.size(); i++) {
                if (context->is_generated_tracked(module_instances[i])) {
                    // swap
                    std::swap(module_instances[i], module_instances[head]);
                    head++;
                }
            }
        }
        std::unordered_map<uint64_t, Generator*> name_map;
        std::unordered_set<std::string> new_names;
        for (auto* const ptr : module_instances) {
            if (context->has_hash(ptr)) {
                uint64_t hash = context->get_hash(ptr);
                if (name_map.find(hash) == name_map.end()) {
                    // need to uniquify it
                    name_map.emplace(hash, ptr);
                    if (new_names.empty()) {
                        // use the original name
                        new_names.emplace(ptr->name);
                    } else {
                        // find a new one
                        uint32_t count = new_names.size() - 1;
                        while (true) {
                            const std::string new_name = ::format("{0}_unq{1}", name, count++);
                            if (!context->generator_name_exists(new_name)) {
                                context->change_generator_name(ptr, new_name);
                                break;
                            }
                        }
                        new_names.emplace(ptr->name);
                    }
                } else {
                    // re-use the old name
                    auto old_name = name_map.at(hash)->name;
                    context->change_generator_name(ptr, old_name);
                }
            }
        }
    }
}